

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_debug.c
# Opt level: O1

int lj_cf_debug_getinfo(lua_State *L)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  byte *what;
  lua_Integer lVar6;
  TValue *pTVar7;
  char *k;
  uint uVar8;
  lua_State *L_00;
  lj_Debug ar;
  lj_Debug local_b0;
  
  pTVar7 = L->base;
  uVar8 = 0;
  L_00 = L;
  if ((pTVar7 < L->top) && ((pTVar7->field_2).it == 0xfffffff9)) {
    uVar8 = 1;
    L_00 = (lua_State *)(ulong)(pTVar7->u32).lo;
  }
  what = (byte *)luaL_optlstring(L,uVar8 + 2,"flnSu",(size_t *)0x0);
  iVar5 = uVar8 + 1;
  iVar4 = lua_isnumber(L,iVar5);
  if (iVar4 == 0) {
    pTVar7 = (TValue *)((ulong)(uVar8 * 8) + (long)L->base);
    if ((L->top <= pTVar7) || ((pTVar7->field_2).it != 0xfffffff7)) {
      lj_err_arg(L,iVar5,LJ_ERR_NOFUNCL);
    }
    what = (byte *)lua_pushfstring(L,">%s",what);
    pTVar7 = L_00->top;
    L_00->top = pTVar7 + 1;
    (pTVar7->field_2).field_0 = L->base[uVar8].field_2.field_0;
    (pTVar7->field_2).it = 0xfffffff7;
  }
  else {
    lVar6 = lua_tointeger(L,iVar5);
    iVar5 = lua_getstack(L_00,(int)lVar6,(lua_Debug *)&local_b0);
    if (iVar5 == 0) {
      *(undefined4 *)((long)L->top + -4) = 0xffffffff;
      return 1;
    }
  }
  iVar5 = lj_debug_getinfo(L_00,(char *)what,&local_b0,1);
  if (iVar5 == 0) {
    lj_err_arg(L,uVar8 + 2,LJ_ERR_INVOPT);
  }
  bVar3 = false;
  lua_createtable(L,0,0x10);
  bVar2 = false;
  do {
    bVar1 = *what;
    if (bVar1 < 0x6c) {
      if (bVar1 < 0x53) {
        if (bVar1 == 0x4c) {
          bVar2 = true;
        }
        else if (bVar1 == 0) {
          if (bVar2) {
            treatstackoption(L,L_00,"activelines");
          }
          if (bVar3) {
            treatstackoption(L,L_00,"func");
          }
          return 1;
        }
      }
      else {
        if (bVar1 == 0x53) {
          lua_pushstring(L,local_b0.source);
          lua_setfield(L,-2,"source");
          lua_pushstring(L,local_b0.short_src);
          lua_setfield(L,-2,"short_src");
          lua_pushinteger(L,(long)local_b0.linedefined);
          lua_setfield(L,-2,"linedefined");
          lua_pushinteger(L,(long)local_b0.lastlinedefined);
          lua_setfield(L,-2,"lastlinedefined");
          lua_pushstring(L,local_b0.what);
          k = "what";
          goto LAB_00123abf;
        }
        if (bVar1 == 0x66) {
          bVar3 = true;
        }
      }
    }
    else {
      if (bVar1 == 0x6c) {
        lua_pushinteger(L,(long)local_b0.currentline);
        k = "currentline";
      }
      else if (bVar1 == 0x6e) {
        lua_pushstring(L,local_b0.name);
        lua_setfield(L,-2,"name");
        lua_pushstring(L,local_b0.namewhat);
        k = "namewhat";
      }
      else {
        if (bVar1 != 0x75) goto LAB_00123ac4;
        lua_pushinteger(L,(long)local_b0.nups);
        lua_setfield(L,-2,"nups");
        lua_pushinteger(L,(long)local_b0.nparams);
        lua_setfield(L,-2,"nparams");
        lua_pushboolean(L,local_b0.isvararg);
        k = "isvararg";
      }
LAB_00123abf:
      lua_setfield(L,-2,k);
    }
LAB_00123ac4:
    what = what + 1;
  } while( true );
}

Assistant:

LJLIB_CF(debug_getinfo)
{
  lj_Debug ar;
  int arg, opt_f = 0, opt_L = 0;
  lua_State *L1 = getthread(L, &arg);
  const char *options = luaL_optstring(L, arg+2, "flnSu");
  if (lua_isnumber(L, arg+1)) {
    if (!lua_getstack(L1, (int)lua_tointeger(L, arg+1), (lua_Debug *)&ar)) {
      setnilV(L->top-1);
      return 1;
    }
  } else if (L->base+arg < L->top && tvisfunc(L->base+arg)) {
    options = lua_pushfstring(L, ">%s", options);
    setfuncV(L1, L1->top++, funcV(L->base+arg));
  } else {
    lj_err_arg(L, arg+1, LJ_ERR_NOFUNCL);
  }
  if (!lj_debug_getinfo(L1, options, &ar, 1))
    lj_err_arg(L, arg+2, LJ_ERR_INVOPT);
  lua_createtable(L, 0, 16);  /* Create result table. */
  for (; *options; options++) {
    switch (*options) {
    case 'S':
      settabss(L, "source", ar.source);
      settabss(L, "short_src", ar.short_src);
      settabsi(L, "linedefined", ar.linedefined);
      settabsi(L, "lastlinedefined", ar.lastlinedefined);
      settabss(L, "what", ar.what);
      break;
    case 'l':
      settabsi(L, "currentline", ar.currentline);
      break;
    case 'u':
      settabsi(L, "nups", ar.nups);
      settabsi(L, "nparams", ar.nparams);
      settabsb(L, "isvararg", ar.isvararg);
      break;
    case 'n':
      settabss(L, "name", ar.name);
      settabss(L, "namewhat", ar.namewhat);
      break;
    case 'f': opt_f = 1; break;
    case 'L': opt_L = 1; break;
    default: break;
    }
  }
  if (opt_L) treatstackoption(L, L1, "activelines");
  if (opt_f) treatstackoption(L, L1, "func");
  return 1;  /* Return result table. */
}